

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<std::error_code_(bool)>::Invoke
          (FunctionMocker<std::error_code_(bool)> *this,bool args)

{
  uint uVar1;
  error_category *peVar2;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<std::error_code> *pAVar3;
  Result RVar4;
  ArgumentTuple tuple;
  undefined1 local_11;
  
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&local_11)
  ;
  pAVar3 = DownCast_<testing::internal::ActionResultHolder<std::error_code>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  uVar1 = (pAVar3->result_).value_._M_value;
  peVar2 = (pAVar3->result_).value_._M_cat;
  (*(pAVar3->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar3);
  RVar4._4_4_ = 0;
  RVar4._M_value = uVar1;
  RVar4._M_cat = peVar2;
  return RVar4;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }